

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plannerbase.cpp
# Opt level: O2

Solver * __thiscall
despot::PlannerBase::InitializeSolver
          (PlannerBase *this,DSPOMDP *model,Belief *belief,string *solver_type,Option *options)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  log_ostream *plVar3;
  ostream *poVar4;
  undefined4 extraout_var_00;
  AEMS *this_00;
  BeliefLowerBound *lowerbound_00;
  BeliefUpperBound *upper_bound;
  POMCPPrior *prior;
  undefined8 uVar5;
  char *pcVar6;
  allocator<char> local_191;
  string blbtype;
  string lbtype;
  string bubtype;
  string ubtype;
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  ScenarioLowerBound *lowerbound;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  
  bVar1 = std::operator==(solver_type,"DESPOT");
  if (bVar1) {
LAB_0016c7db:
    if (options[0x12].desc == (Descriptor *)0x0) {
      pcVar6 = "DEFAULT";
    }
    else {
      pcVar6 = options[0x12].arg;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&blbtype,pcVar6,(allocator<char> *)&lbtype);
    if (options[0x13].desc == (Descriptor *)0x0) {
      pcVar6 = "DEFAULT";
    }
    else {
      pcVar6 = options[0x13].arg;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&lbtype,pcVar6,(allocator<char> *)&bubtype);
    std::__cxx11::string::string(local_50,(string *)&lbtype);
    std::__cxx11::string::string(local_70,(string *)&blbtype);
    iVar2 = (*model->_vptr_DSPOMDP[0xf])(model,local_50,local_70);
    lowerbound = (ScenarioLowerBound *)CONCAT44(extraout_var,iVar2);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_50);
    iVar2 = logging::level();
    if (0 < iVar2) {
      iVar2 = logging::level();
      if (iVar2 < 3) goto LAB_0016c8f0;
      plVar3 = logging::stream(3);
      poVar4 = std::operator<<(&plVar3->super_ostream,"Created lower bound ");
      if (lowerbound != (ScenarioLowerBound *)0x0) {
        poVar4 = std::operator<<(poVar4,*(char **)(lowerbound->_vptr_ScenarioLowerBound[-1] + 8) +
                                        (**(char **)(lowerbound->_vptr_ScenarioLowerBound[-1] + 8)
                                        == '*'));
        std::endl<char,std::char_traits<char>>(poVar4);
        goto LAB_0016c8f0;
      }
      __cxa_bad_typeid();
LAB_0016ce0f:
      __cxa_bad_typeid();
LAB_0016ce14:
      __cxa_bad_typeid();
LAB_0016ce19:
      poVar4 = std::operator<<((ostream *)&std::cerr,"ERROR: Unsupported solver type: ");
      poVar4 = std::operator<<(poVar4,(string *)solver_type);
      std::endl<char,std::char_traits<char>>(poVar4);
      exit(1);
    }
LAB_0016c8f0:
    bVar1 = std::operator==(solver_type,"DESPOT");
    if (bVar1) {
      if (options[0x14].desc == (Descriptor *)0x0) {
        pcVar6 = "DEFAULT";
      }
      else {
        pcVar6 = options[0x14].arg;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bubtype,pcVar6,(allocator<char> *)&ubtype);
      if (options[0x15].desc == (Descriptor *)0x0) {
        pcVar6 = "DEFAULT";
      }
      else {
        pcVar6 = options[0x15].arg;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&ubtype,pcVar6,&local_191);
      std::__cxx11::string::string(local_90,(string *)&ubtype);
      std::__cxx11::string::string(local_b0,(string *)&bubtype);
      iVar2 = (*model->_vptr_DSPOMDP[0xd])(model,local_90,local_b0);
      solver_type = (string *)CONCAT44(extraout_var_00,iVar2);
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_90);
      iVar2 = logging::level();
      if (0 < iVar2) {
        iVar2 = logging::level();
        if (2 < iVar2) {
          plVar3 = logging::stream(3);
          poVar4 = std::operator<<(&plVar3->super_ostream,"Created upper bound ");
          if (solver_type == (string *)0x0) goto LAB_0016ce0f;
          pcVar6 = *(char **)(*(_func_int **)((long)(solver_type->_M_dataplus)._M_p + -8) + 8);
          poVar4 = std::operator<<(poVar4,pcVar6 + (*pcVar6 == '*'));
          std::endl<char,std::char_traits<char>>(poVar4);
        }
      }
      this_00 = (AEMS *)operator_new(0xc0);
      DESPOT::DESPOT((DESPOT *)this_00,model,lowerbound,(ScenarioUpperBound *)solver_type,
                     (Belief *)0x0);
      std::__cxx11::string::~string((string *)&ubtype);
      std::__cxx11::string::~string((string *)&bubtype);
    }
    else {
      this_00 = (AEMS *)operator_new(0x50);
      ScenarioBaselineSolver::ScenarioBaselineSolver
                ((ScenarioBaselineSolver *)this_00,lowerbound,(Belief *)0x0);
    }
  }
  else {
    bVar1 = std::operator==(solver_type,"PLB");
    if (bVar1) goto LAB_0016c7db;
    bVar1 = std::operator==(solver_type,"AEMS");
    if (!bVar1) {
      bVar1 = std::operator==(solver_type,"BLB");
      if (!bVar1) {
        bVar1 = std::operator==(solver_type,"POMCP");
        if (!bVar1) {
          bVar1 = std::operator==(solver_type,"DPOMCP");
          if (!bVar1) goto LAB_0016ce19;
        }
        if (options[0x1e].desc == (Descriptor *)0x0) {
          pcVar6 = "DEFAULT";
        }
        else {
          pcVar6 = options[0x1e].arg;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&blbtype,pcVar6,(allocator<char> *)&lbtype);
        std::__cxx11::string::string(local_110,(string *)&blbtype);
        iVar2 = (*model->_vptr_DSPOMDP[0x10])(model,local_110);
        prior = (POMCPPrior *)CONCAT44(extraout_var_03,iVar2);
        std::__cxx11::string::~string(local_110);
        iVar2 = logging::level();
        if (0 < iVar2) {
          iVar2 = logging::level();
          if (2 < iVar2) {
            plVar3 = logging::stream(3);
            poVar4 = std::operator<<(&plVar3->super_ostream,"Created POMCP prior ");
            if (prior == (POMCPPrior *)0x0) goto LAB_0016ce4c;
            poVar4 = std::operator<<(poVar4,*(char **)(prior->_vptr_POMCPPrior[-1] + 8) +
                                            (**(char **)(prior->_vptr_POMCPPrior[-1] + 8) == '*'));
            std::endl<char,std::char_traits<char>>(poVar4);
          }
        }
        if (options[0xb].desc != (Descriptor *)0x0) {
          prior->exploration_constant_ = DAT_0019fde0;
        }
        bVar1 = std::operator==(solver_type,"POMCP");
        if (bVar1) {
          this_00 = (AEMS *)operator_new(0x60);
          POMCP::POMCP((POMCP *)this_00,model,prior,(Belief *)0x0);
        }
        else {
          this_00 = (AEMS *)operator_new(0x60);
          DPOMCP::DPOMCP((DPOMCP *)this_00,model,prior,(Belief *)0x0);
        }
        goto LAB_0016ccbd;
      }
    }
    if (options[0x13].desc == (Descriptor *)0x0) {
      pcVar6 = "DEFAULT";
    }
    else {
      pcVar6 = options[0x13].arg;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&blbtype,pcVar6,(allocator<char> *)&lbtype);
    std::__cxx11::string::string(local_d0,(string *)&blbtype);
    iVar2 = (*model->_vptr_DSPOMDP[0x1a])(model,local_d0);
    lowerbound_00 = (BeliefLowerBound *)CONCAT44(extraout_var_01,iVar2);
    std::__cxx11::string::~string(local_d0);
    iVar2 = logging::level();
    if (0 < iVar2) {
      iVar2 = logging::level();
      if (iVar2 < 3) goto LAB_0016cb5f;
      plVar3 = logging::stream(3);
      poVar4 = std::operator<<(&plVar3->super_ostream,"Created lower bound ");
      if (lowerbound_00 != (BeliefLowerBound *)0x0) {
        poVar4 = std::operator<<(poVar4,*(char **)(lowerbound_00->_vptr_BeliefLowerBound[-1] + 8) +
                                        (**(char **)(lowerbound_00->_vptr_BeliefLowerBound[-1] + 8)
                                        == '*'));
        std::endl<char,std::char_traits<char>>(poVar4);
        goto LAB_0016cb5f;
      }
      goto LAB_0016ce14;
    }
LAB_0016cb5f:
    bVar1 = std::operator==(solver_type,"AEMS");
    if (!bVar1) {
      this_00 = (AEMS *)operator_new(0x50);
      BeliefBaselineSolver::BeliefBaselineSolver
                ((BeliefBaselineSolver *)this_00,lowerbound_00,(Belief *)0x0);
      goto LAB_0016ccbd;
    }
    if (options[0x15].desc == (Descriptor *)0x0) {
      pcVar6 = "DEFAULT";
    }
    else {
      pcVar6 = options[0x15].arg;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&lbtype,pcVar6,(allocator<char> *)&bubtype);
    std::__cxx11::string::string(local_f0,(string *)&lbtype);
    iVar2 = (*model->_vptr_DSPOMDP[0x1b])(model,local_f0);
    upper_bound = (BeliefUpperBound *)CONCAT44(extraout_var_02,iVar2);
    std::__cxx11::string::~string(local_f0);
    iVar2 = logging::level();
    if (0 < iVar2) {
      iVar2 = logging::level();
      if (2 < iVar2) {
        plVar3 = logging::stream(3);
        poVar4 = std::operator<<(&plVar3->super_ostream,"Created upper bound ");
        if (upper_bound == (BeliefUpperBound *)0x0) {
          __cxa_bad_typeid();
LAB_0016ce4c:
          uVar5 = __cxa_bad_typeid();
          operator_delete(options,0x60);
          std::__cxx11::string::~string((string *)&blbtype);
          _Unwind_Resume(uVar5);
        }
        poVar4 = std::operator<<(poVar4,*(char **)(upper_bound->_vptr_BeliefUpperBound[-1] + 8) +
                                        (**(char **)(upper_bound->_vptr_BeliefUpperBound[-1] + 8) ==
                                        '*'));
        std::endl<char,std::char_traits<char>>(poVar4);
      }
    }
    this_00 = (AEMS *)operator_new(0xd0);
    AEMS::AEMS(this_00,model,lowerbound_00,upper_bound,(Belief *)0x0);
  }
  std::__cxx11::string::~string((string *)&lbtype);
LAB_0016ccbd:
  std::__cxx11::string::~string((string *)&blbtype);
  (*(this_00->super_Solver)._vptr_Solver[4])(this_00,belief);
  return &this_00->super_Solver;
}

Assistant:

Solver *PlannerBase::InitializeSolver(DSPOMDP *model, Belief* belief,
		string solver_type, option::Option *options) {
	Solver *solver = NULL;
	// DESPOT or its default policy
	if (solver_type == "DESPOT" || solver_type == "PLB") // PLB: particle lower bound
			{
		string blbtype =
				options[E_BLBTYPE] ? options[E_BLBTYPE].arg : "DEFAULT";
		string lbtype = options[E_LBTYPE] ? options[E_LBTYPE].arg : "DEFAULT";
		ScenarioLowerBound *lower_bound = model->CreateScenarioLowerBound(
				lbtype, blbtype);

		logi << "Created lower bound " << typeid(*lower_bound).name() << endl;

		if (solver_type == "DESPOT") {
			string bubtype =
					options[E_BUBTYPE] ? options[E_BUBTYPE].arg : "DEFAULT";
			string ubtype =
					options[E_UBTYPE] ? options[E_UBTYPE].arg : "DEFAULT";
			ScenarioUpperBound *upper_bound = model->CreateScenarioUpperBound(
					ubtype, bubtype);

			logi << "Created upper bound " << typeid(*upper_bound).name()
					<< endl;

			solver = new DESPOT(model, lower_bound, upper_bound);
		} else
			solver = new ScenarioBaselineSolver(lower_bound);
	} // AEMS or its default policy
	else if (solver_type == "AEMS" || solver_type == "BLB") {
		string lbtype = options[E_LBTYPE] ? options[E_LBTYPE].arg : "DEFAULT";
		BeliefLowerBound *lower_bound =
				static_cast<BeliefMDP *>(model)->CreateBeliefLowerBound(lbtype);

		logi << "Created lower bound " << typeid(*lower_bound).name() << endl;

		if (solver_type == "AEMS") {
			string ubtype =
					options[E_UBTYPE] ? options[E_UBTYPE].arg : "DEFAULT";
			BeliefUpperBound *upper_bound =
					static_cast<BeliefMDP *>(model)->CreateBeliefUpperBound(
							ubtype);

			logi << "Created upper bound " << typeid(*upper_bound).name()
					<< endl;

			solver = new AEMS(model, lower_bound, upper_bound);
		} else
			solver = new BeliefBaselineSolver(lower_bound);
	} // POMCP or DPOMCP
	else if (solver_type == "POMCP" || solver_type == "DPOMCP") {
		string ptype = options[E_PRIOR] ? options[E_PRIOR].arg : "DEFAULT";
		POMCPPrior *prior = model->CreatePOMCPPrior(ptype);

		logi << "Created POMCP prior " << typeid(*prior).name() << endl;

		if (options[E_PRUNE]) {
			prior->exploration_constant(Globals::config.pruning_constant);
		}

		if (solver_type == "POMCP")
			solver = new POMCP(model, prior);
		else
			solver = new DPOMCP(model, prior);
	} else { // Unsupported solver
		cerr << "ERROR: Unsupported solver type: " << solver_type << endl;
		exit(1);
	}

	assert(solver != NULL);
	solver->belief(belief);

	return solver;
}